

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint8_t *data;
  int32_t currentLen;
  int32_t oldIndent;
  dtl_json_writer_t *self_local;
  
  if (0 < self->indentWidth) {
    iVar1 = self->currentIndent;
    iVar2 = adt_bytearray_length(self->indentArray);
    self->currentIndent = self->indentWidth + self->currentIndent;
    if (iVar2 < self->currentIndent) {
      dtl_json_writer_growIndentArray(self);
    }
    else {
      lVar3 = adt_bytearray_data(self->indentArray);
      memset((void *)(lVar3 + iVar1),0x20,(long)self->indentWidth);
      *(undefined1 *)(lVar3 + self->currentIndent) = 0;
    }
  }
  return;
}

Assistant:

static void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)
{
   if (self->indentWidth > 0)
   {
      int32_t oldIndent = self->currentIndent;
      int32_t currentLen = adt_bytearray_length(self->indentArray);
      self->currentIndent+=self->indentWidth;
      if (currentLen < self->currentIndent)
      {
         dtl_json_writer_growIndentArray(self);
      }
      else
      {
         uint8_t *data = adt_bytearray_data(self->indentArray);
         memset(&data[oldIndent], m_indentChar, self->indentWidth);
         data[self->currentIndent] = 0u;
      }
   }
}